

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int fits_calc_binningde(fitsfile *fptr,int naxis,char (*colname) [71],char **colexpr,double *minin,
                       double *maxin,double *binsizein,char (*minname) [71],char (*maxname) [71],
                       char (*binname) [71],int *colnum,int *datatypes,long *haxes,double *amin,
                       double *amax,double *binsize,long *repeat,int *status)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  bool bVar4;
  double dVar5;
  undefined1 local_388 [8];
  ParseData lParse;
  int naxis_1;
  long naxes [5];
  long nelem;
  double dStack_260;
  int ncols;
  double datamax;
  double datamin;
  long repeat1;
  int local_240;
  int use_datamax;
  int ibin;
  int imax;
  int imin;
  int datatype;
  int ii;
  int tstatus;
  char keyname [75];
  char errmsg [81];
  char local_178 [8];
  char cpref [4] [71];
  char *cptr;
  tcolumn *colptr;
  double *maxin_local;
  double *minin_local;
  char **colexpr_local;
  char (*colname_local) [71];
  int naxis_local;
  fitsfile *fptr_local;
  
  repeat1._4_4_ = 0;
  if (*status < 1) {
    if (repeat != (long *)0x0) {
      *repeat = 0;
    }
    if (naxis < 5) {
      if (fptr->HDUposition != fptr->Fptr->curhdu) {
        ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
      }
      local_178[0] = '\0';
      cpref[0][0x3f] = '\0';
      cpref[1][0x3f] = '\0';
      cpref[2][0x3f] = '\0';
      datatype = 0;
      ffgky(fptr,0x10,"CPREF",local_178,(char *)0x0,&datatype);
      if (datatype == 0) {
        unique0x00004880 = local_178;
        while( true ) {
          bVar4 = false;
          if (*stack0xffffffffffffffa8 != ',') {
            bVar4 = *stack0xffffffffffffffa8 != '\0';
          }
          if (!bVar4) break;
          register0x00000000 = stack0xffffffffffffffa8 + 1;
        }
        if (*stack0xffffffffffffffa8 != '\0') {
          *stack0xffffffffffffffa8 = '\0';
          do {
            stack0xffffffffffffffa8 = unique0x10000742 + 1;
          } while (*stack0xffffffffffffffa8 == ' ');
          strcpy(cpref[0] + 0x3f,stack0xffffffffffffffa8);
          register0x00000000 = cpref[0] + 0x3f;
          while( true ) {
            bVar4 = false;
            if (*stack0xffffffffffffffa8 != ',') {
              bVar4 = *stack0xffffffffffffffa8 != '\0';
            }
            if (!bVar4) break;
            register0x00000000 = stack0xffffffffffffffa8 + 1;
          }
          if (*stack0xffffffffffffffa8 != '\0') {
            *stack0xffffffffffffffa8 = '\0';
            do {
              stack0xffffffffffffffa8 = unique0x1000074a + 1;
            } while (*stack0xffffffffffffffa8 == ' ');
            strcpy(cpref[1] + 0x3f,stack0xffffffffffffffa8);
            register0x00000000 = cpref[1] + 0x3f;
            while( true ) {
              bVar4 = false;
              if (*stack0xffffffffffffffa8 != ',') {
                bVar4 = *stack0xffffffffffffffa8 != '\0';
              }
              if (!bVar4) break;
              register0x00000000 = stack0xffffffffffffffa8 + 1;
            }
            if (*stack0xffffffffffffffa8 != '\0') {
              *stack0xffffffffffffffa8 = '\0';
              do {
                stack0xffffffffffffffa8 = unique0x10000752 + 1;
              } while (*stack0xffffffffffffffa8 == ' ');
              strcpy(cpref[2] + 0x3f,stack0xffffffffffffffa8);
            }
          }
        }
      }
      for (imin = 0; imin < naxis; imin = imin + 1) {
        if (((colname[imin][0] == '\0') &&
            (((colexpr == (char **)0x0 || (colexpr[imin] == (char *)0x0)) ||
             (*colexpr[imin] == '\0')))) &&
           (strcpy(colname[imin],cpref[(long)imin + -1] + 0x3f), colname[imin][0] == '\0')) {
          if (imin == 0) {
            strcpy(*colname,"X");
          }
          else if (imin == 1) {
            strcpy(colname[1],"Y");
          }
          else if (imin == 2) {
            strcpy(colname[2],"Z");
          }
          else if (imin == 3) {
            strcpy(colname[3],"T");
          }
        }
        colnum[imin] = 0;
        if (((colexpr == (char **)0x0) || (colexpr[imin] == (char *)0x0)) ||
           (*colexpr[imin] == '\0')) {
          iVar1 = ffgcno(fptr,0,colname[imin],colnum + imin,status);
          if (0 < iVar1) {
            strcpy(keyname + 0x48,"column for histogram axis doesn\'t exist: ");
            lVar3 = (long)imin;
            sVar2 = strlen(keyname + 0x48);
            strncat(keyname + 0x48,colname[lVar3],0x50 - sVar2);
            ffpmsg(keyname + 0x48);
            return *status;
          }
          ffeqty(fptr,colnum[imin],&imax,(long *)&datamin,(long *)0x0,status);
        }
        else {
          iVar1 = ffiprs(fptr,0,colexpr[imin],5,&imax,naxes + 4,(int *)&lParse.field_0xe4,
                         (long *)&stack0xfffffffffffffd68,(ParseData *)local_388,status);
          if (iVar1 != 0) {
            snprintf(keyname + 0x48,0x51,"Parser error of binning expression: %s",colexpr[imin]);
            ffpmsg(keyname + 0x48);
            return *status;
          }
          if (naxes[4] < 0) {
            naxes[4] = 1;
          }
          datamin = (double)naxes[4];
          ffcprs((ParseData *)local_388);
        }
        if ((imax < 0) || (imax == 0x10)) {
          strcpy(keyname + 0x48,"Inappropriate datatype; can\'t bin this column: ");
          lVar3 = (long)imin;
          sVar2 = strlen(keyname + 0x48);
          strncat(keyname + 0x48,colname[lVar3],0x50 - sVar2);
          ffpmsg(keyname + 0x48);
          *status = 0x19a;
          return 0x19a;
        }
        if (repeat != (long *)0x0) {
          if (imin == 0) {
            *repeat = (long)datamin;
          }
          else if ((double)*repeat != datamin) {
            strcpy(keyname + 0x48,"Vector repeat of input columns do not agree");
            ffpmsg(keyname + 0x48);
            *status = 0x140;
            return 0x140;
          }
        }
        if (datatypes != (int *)0x0) {
          datatypes[imin] = imax;
        }
        datamax = -9.1191291391491e-36;
        dStack_260 = -9.1191291391491e-36;
        if ((minname[imin][0] != '\0') &&
           (iVar1 = ffgky(fptr,0x52,minname[imin],minin + imin,(char *)0x0,status), iVar1 != 0)) {
          ffpmsg("error reading histogramming minimum keyword");
          ffpmsg(minname[imin]);
          return *status;
        }
        if ((minin[imin] != -9.1191291391491e-36) || (NAN(minin[imin]))) {
          amin[imin] = minin[imin];
        }
        else if (((colexpr == (char **)0x0) || (colexpr[imin] == (char *)0x0)) ||
                (*colexpr[imin] == '\0')) {
          ffkeyn("TLMIN",colnum[imin],(char *)&ii,status);
          iVar1 = ffgky(fptr,0x52,(char *)&ii,amin + imin,(char *)0x0,status);
          if (0 < iVar1) {
            *status = 0;
            iVar1 = fits_get_col_minmax(fptr,colnum[imin],amin + imin,&stack0xfffffffffffffda0,
                                        status);
            if (0 < iVar1) {
              strcpy(keyname + 0x48,"Error calculating datamin and datamax for column: ");
              lVar3 = (long)imin;
              sVar2 = strlen(keyname + 0x48);
              strncat(keyname + 0x48,colname[lVar3],0x50 - sVar2);
              ffpmsg(keyname + 0x48);
              return *status;
            }
          }
        }
        else {
          iVar1 = fits_get_expr_minmax
                            (fptr,colexpr[imin],amin + imin,&stack0xfffffffffffffda0,(int *)0x0,
                             status);
          if (0 < iVar1) {
            strcpy(keyname + 0x48,"Error calculating datamin and datamax for expression: ");
            ffpmsg(keyname + 0x48);
            ffpmsg(colexpr[imin]);
            return *status;
          }
          if ((amin[imin] == -9.1191291391491e-36) && (!NAN(amin[imin]))) {
            amin[imin] = 0.0;
          }
        }
        if ((maxname[imin][0] != '\0') &&
           (iVar1 = ffgky(fptr,0x52,maxname[imin],maxin + imin,(char *)0x0,status), iVar1 != 0)) {
          ffpmsg("error reading histogramming maximum keyword");
          ffpmsg(maxname[imin]);
          return *status;
        }
        if ((maxin[imin] != -9.1191291391491e-36) || (NAN(maxin[imin]))) {
          amax[imin] = maxin[imin];
        }
        else {
          if (((colexpr == (char **)0x0) || (colexpr[imin] == (char *)0x0)) ||
             (*colexpr[imin] == '\0')) {
            ffkeyn("TLMAX",colnum[imin],(char *)&ii,status);
            iVar1 = ffgky(fptr,0x52,(char *)&ii,amax + imin,(char *)0x0,status);
            if (0 < iVar1) {
              *status = 0;
              if ((dStack_260 != -9.1191291391491e-36) || (NAN(dStack_260))) {
                amax[imin] = dStack_260;
              }
              else {
                iVar1 = fits_get_col_minmax(fptr,colnum[imin],&datamax,amax + imin,status);
                if (0 < iVar1) {
                  strcpy(keyname + 0x48,"Error calculating datamin and datamax for column: ");
                  lVar3 = (long)imin;
                  sVar2 = strlen(keyname + 0x48);
                  strncat(keyname + 0x48,colname[lVar3],0x50 - sVar2);
                  ffpmsg(keyname + 0x48);
                  return *status;
                }
              }
            }
          }
          else {
            iVar1 = fits_get_expr_minmax(fptr,colexpr[imin],&datamax,amax + imin,(int *)0x0,status);
            if (0 < iVar1) {
              strcpy(keyname + 0x48,"Error calculating datamin and datamax for expression: ");
              ffpmsg(keyname + 0x48);
              ffpmsg(colexpr[imin]);
              return *status;
            }
            if ((amax[imin] == -9.1191291391491e-36) && (!NAN(amax[imin]))) {
              amin[imin] = 1.0;
            }
          }
          repeat1._4_4_ = 1;
        }
        if ((binname[imin][0] != '\0') &&
           (iVar1 = ffgky(fptr,0x52,binname[imin],binsizein + imin,(char *)0x0,status), iVar1 != 0))
        {
          ffpmsg("error reading histogramming binsize keyword");
          ffpmsg(binname[imin]);
          return *status;
        }
        if ((binsizein[imin] == 0.0) && (!NAN(binsizein[imin]))) {
          ffpmsg("error: histogram binsize = 0");
          *status = 0x142;
          return 0x142;
        }
        if ((binsizein[imin] != -9.1191291391491e-36) || (NAN(binsizein[imin]))) {
          binsize[imin] = binsizein[imin];
        }
        else {
          datatype = 0;
          if (((colexpr == (char **)0x0) || (colexpr[imin] == (char *)0x0)) ||
             (*colexpr[imin] == '\0')) {
            ffkeyn("TDBIN",colnum[imin],(char *)&ii,&datatype);
            ffgky(fptr,0x52,(char *)&ii,binsizein + imin,(char *)0x0,&datatype);
          }
          if (((datatype != 0) ||
              (((colexpr != (char **)0x0 && (colexpr[imin] != (char *)0x0)) &&
               (*colexpr[imin] != '\0')))) &&
             (binsize[imin] = (amax[imin] - amin[imin]) / 10.0, 1.0 < binsize[imin])) {
            binsize[imin] = 1.0;
          }
        }
        if (((amax[imin] <= amin[imin] && amin[imin] != amax[imin]) && (0.0 < binsize[imin])) ||
           ((amin[imin] < amax[imin] && (binsize[imin] <= 0.0 && binsize[imin] != 0.0)))) {
          binsize[imin] = -binsize[imin];
        }
        local_240 = (int)binsize[imin];
        ibin = (int)amin[imin];
        use_datamax = (int)amax[imin];
        if (((((0x29 < imax) || ((double)ibin != amin[imin])) ||
             (NAN((double)ibin) || NAN(amin[imin]))) ||
            (((double)use_datamax != amax[imin] || (NAN((double)use_datamax) || NAN(amax[imin])))))
           || (((double)local_240 != binsize[imin] || (NAN((double)local_240) || NAN(binsize[imin]))
               ))) {
          if (repeat1._4_4_ == 0) {
            haxes[imin] = (long)((amax[imin] - amin[imin]) / binsize[imin]);
            if (amax[imin] <= amin[imin]) {
              dVar5 = (double)haxes[imin] * binsize[imin] + amin[imin];
              if (amax[imin] <= dVar5 && dVar5 != amax[imin]) {
                haxes[imin] = haxes[imin] + 1;
              }
            }
            else if ((double)haxes[imin] * binsize[imin] + amin[imin] < amax[imin]) {
              haxes[imin] = haxes[imin] + 1;
            }
          }
          else {
            haxes[imin] = (long)((amax[imin] - amin[imin]) / binsize[imin] + 1.0);
          }
        }
        else {
          haxes[imin] = (long)((use_datamax - ibin) / local_240 + 1);
          if (amax[imin] <= amin[imin]) {
            amin[imin] = amin[imin] + 0.5;
            amax[imin] = amax[imin] - 0.5;
          }
          else {
            amin[imin] = amin[imin] - 0.5;
            amax[imin] = amax[imin] + 0.5;
          }
        }
      }
      fptr_local._4_4_ = *status;
    }
    else {
      ffpmsg("histograms with more than 4 dimensions are not supported");
      *status = 0x140;
      fptr_local._4_4_ = 0x140;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int fits_calc_binningde(
      fitsfile *fptr,  /* IO - pointer to table to be binned      ;       */
      int naxis,       /* I - number of axes/columns in the binned image  */
      char colname[4][FLEN_VALUE],   /* I - optional column names         */
      char *colexpr[4],  /* I - optional column expression instead of name*/
      double *minin,     /* I - optional lower bound value for each axis  */
      double *maxin,     /* I - optional upper bound value, for each axis */
      double *binsizein, /* I - optional bin size along each axis         */
      char minname[4][FLEN_VALUE], /* I - optional keywords for min       */
      char maxname[4][FLEN_VALUE], /* I - optional keywords for max       */
      char binname[4][FLEN_VALUE], /* I - optional keywords for binsize   */

    /* The returned parameters for each axis of the n-dimensional histogram are */

      int *colnum,     /* O - column numbers, to be binned */
      int *datatypes,  /* O - datatypes of each output column */
      long *haxes,     /* O - number of bins in each histogram axis */
      double *amin,     /* O - lower bound of the histogram axes */
      double *amax,     /* O - upper bound of the histogram axes */
      double *binsize,  /* O - width of histogram bins/pixels on each axis */
      long *repeat,     /* O - vector repeat of input columns */
      int *status)
/*_
    Calculate the actual binning parameters, based on various user input
    options.

    Note: caller is responsible to free parsers[*] upon return using ffcprs()
*/
{
    tcolumn *colptr;
    char *cptr, cpref[4][FLEN_VALUE];
    char errmsg[FLEN_ERRMSG], keyname[FLEN_KEYWORD];
    int tstatus, ii;
    int datatype, imin, imax, ibin,  use_datamax = 0;
    long repeat1;
    double datamin, datamax;
    int ncols;

    /* check inputs */
    
    if (*status > 0)
        return(*status);

    /* Initialize the number of iterator columns required */
    if (repeat)    (*repeat) = 0;

    if (naxis > 4)
    {
        ffpmsg("histograms with more than 4 dimensions are not supported");
        return(*status = BAD_DIMEN);
    }

    /* reset position to the correct HDU if necessary */
    if ((fptr)->HDUposition != ((fptr)->Fptr)->curhdu)
        ffmahd(fptr, ((fptr)->HDUposition) + 1, NULL, status);
    
    /* ============================================================= */
    /* The CPREF keyword, if it exists, gives the preferred columns. */
    /* Otherwise, assume "X", "Y", "Z", and "T"  */

    *cpref[0] = '\0';
    *cpref[1] = '\0';
    *cpref[2] = '\0';
    *cpref[3] = '\0';

    tstatus = 0;
    ffgky(fptr, TSTRING, "CPREF", cpref[0], NULL, &tstatus);

    if (!tstatus)
    {
        /* Preferred column names are given;  separate them */
        cptr = cpref[0];

        /* the first preferred axis... */
        while (*cptr != ',' && *cptr != '\0')
           cptr++;

        if (*cptr != '\0')
        {
           *cptr = '\0';
           cptr++;
           while (*cptr == ' ')
               cptr++;

           strcpy(cpref[1], cptr);
           cptr = cpref[1];

          /* the second preferred axis... */
          while (*cptr != ',' && *cptr != '\0')
             cptr++;

          if (*cptr != '\0')
          {
             *cptr = '\0';
             cptr++;
             while (*cptr == ' ')
                 cptr++;

             strcpy(cpref[2], cptr);
             cptr = cpref[2];

            /* the third preferred axis... */
            while (*cptr != ',' && *cptr != '\0')
               cptr++;

            if (*cptr != '\0')
            {
               *cptr = '\0';
               cptr++;
               while (*cptr == ' ')
                   cptr++;

               strcpy(cpref[3], cptr);

            }
          }
        }
    }

    /* ============================================================= */
    /* Main Loop for calculating parameters for each column          */

    for (ii = 0; ii < naxis; ii++)
    {

      /* =========================================================== */
      /* Determine column Number, based on, in order of priority,
         1  input column name, or
	 2  name given by CPREF keyword, or
	 3  assume X, Y, Z and T for the name
      */

      if (*colname[ii] == '\0' && 
	  (colexpr == 0 || colexpr[ii] == 0 || colexpr[ii][0] == '\0'))
      {
         strcpy(colname[ii], cpref[ii]); /* try using the preferred column */
         if (*colname[ii] == '\0')
         {
           if (ii == 0)
              strcpy(colname[ii], "X");
           else if (ii == 1)
              strcpy(colname[ii], "Y");
           else if (ii == 2)
              strcpy(colname[ii], "Z");
           else if (ii == 3)
              strcpy(colname[ii], "T");
         }
      }

      /* get the column number in the table */
      colnum[ii] = 0;
      if (colexpr == 0 || colexpr[ii] == 0 || colexpr[ii][0] == '\0')
      {
	if (ffgcno(fptr, CASEINSEN, colname[ii], colnum+ii, status) > 0)
	  {
	    strcpy(errmsg, "column for histogram axis doesn't exist: ");
	    strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
	    ffpmsg(errmsg);
	    return(*status);
	  }
	
	/* ================================================================ */
	/* check tha column is not a vector or a string                     */
	
	/* get the datatype of the column */
	fits_get_eqcoltype(fptr, colnum[ii], &datatype,
			   &repeat1, NULL, status);
	
	ncols = 1; /* Require only one iterator column, the actual column */

      } else { /* column expression: use parse to determine datatype and dimensions */

	long nelem, naxes[MAXDIMS];
	int naxis;
	ParseData lParse;

	/* Initialize the parser so that we can determine the datatype
	   of the returned type as well as the vector dimensions */
	if ( ffiprs( fptr, 0, colexpr[ii], MAXDIMS, &datatype, &nelem, &naxis,
		     naxes, &lParse, status ) ) {
	  snprintf(errmsg, FLEN_ERRMSG, 
		   "Parser error of binning expression: %s", 
		   colexpr[ii]);
	  ffpmsg(errmsg);
	  return *status;
	}
	if (nelem < 0) nelem = 1; /* If it's a constant expression */

	repeat1 = nelem;

	/* We require lParse.nCols columns to be read from input,
	   plus one for the Temporary calculator result */
	ncols = lParse.nCols + 1;
	ffcprs( &lParse );
      }

      /* Not sure why this repeat limitation is here -- CM
	 The iterator system can handle vector columns just fine
`       */
      if (datatype < 0 || datatype == TSTRING)
      {
	strcpy(errmsg, "Inappropriate datatype; can't bin this column: ");
	strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
	ffpmsg(errmsg);
	return(*status = BAD_DATATYPE);
      }

      /* Store repeat value for future use */
      if (repeat) {
	if (ii == 0) {
	  *repeat = repeat1; /* First time around save the repeat value */

	} else if (*repeat != repeat1) { /* later dimensions, keep same dims */

	  strcpy(errmsg, "Vector repeat of input columns do not agree");
	  ffpmsg(errmsg);
	  return (*status = BAD_DIMEN);
	}
      }

      if (datatypes) datatypes[ii] = datatype;

      /* ================================================================ */
      /* get the minimum value */

      datamin = DOUBLENULLVALUE;
      datamax = DOUBLENULLVALUE;
      
      if (*minname[ii])
      {
         if (ffgky(fptr, TDOUBLE, minname[ii], &minin[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming minimum keyword");
             ffpmsg(minname[ii]);
             return(*status);
         }
      }

      if (minin[ii] != DOUBLENULLVALUE)
      {
        amin[ii] = (double) minin[ii];
      }
      else if (colexpr == 0 || colexpr[ii] == 0 || colexpr[ii][0] == '\0')
      {
        ffkeyn("TLMIN", colnum[ii], keyname, status);
        if (ffgky(fptr, TDOUBLE, keyname, amin+ii, NULL, status) > 0)
        {
            /* use actual data minimum value for the histogram minimum */
            *status = 0;
            if (fits_get_col_minmax(fptr, colnum[ii], amin+ii, &datamax, status) > 0)
            {
                strcpy(errmsg, "Error calculating datamin and datamax for column: ");
                strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
                ffpmsg(errmsg);
                return(*status);
            }
         }
      } else { /* it's an expression */
	if (fits_get_expr_minmax(fptr, colexpr[ii], amin+ii, &datamax, 0, status) > 0)
            {
                strcpy(errmsg, "Error calculating datamin and datamax for expression: ");
                ffpmsg(errmsg);
		ffpmsg(colexpr[ii]);
                return(*status);
            }
	if (amin[ii] == DOUBLENULLVALUE) amin[ii] = 0.0;
	
      }

      /* ================================================================ */
      /* get the maximum value */

      if (*maxname[ii])
      {
         if (ffgky(fptr, TDOUBLE, maxname[ii], &maxin[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming maximum keyword");
             ffpmsg(maxname[ii]);
             return(*status);
         }
      }

      if (maxin[ii] != DOUBLENULLVALUE)
      {
        amax[ii] = (double) maxin[ii];
      }
      else if (colexpr == 0 || colexpr[ii] == 0 || colexpr[ii][0] == '\0')
      {
        ffkeyn("TLMAX", colnum[ii], keyname, status);
        if (ffgky(fptr, TDOUBLE, keyname, &amax[ii], NULL, status) > 0)
        {
          *status = 0;
          if(datamax != DOUBLENULLVALUE)  /* already computed max value */
          {
             amax[ii] = datamax;
          }
          else
          {
             /* use actual data maximum value for the histogram maximum */
             if (fits_get_col_minmax(fptr, colnum[ii], &datamin, &amax[ii], status) > 0)
             {
                 strcpy(errmsg, "Error calculating datamin and datamax for column: ");
                 strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
                 ffpmsg(errmsg);
                 return(*status);
             }
          }
        }
        use_datamax = 1;  /* flag that the max was determined by the data values */
                          /* and not specifically set by the calling program */

      } else { /* it's an expression */

	if (fits_get_expr_minmax(fptr, colexpr[ii], &datamin, &amax[ii], 0, status) > 0)
	{
	  strcpy(errmsg, "Error calculating datamin and datamax for expression: ");
	  ffpmsg(errmsg);
	  ffpmsg(colexpr[ii]);
	  return(*status);
	}
	if (amax[ii] == DOUBLENULLVALUE) amin[ii] = 1.0;
        use_datamax = 1;  
      }


      /* ================================================================ */
      /* determine binning size and range                                 */

      if (*binname[ii])
      {
         if (ffgky(fptr, TDOUBLE, binname[ii], &binsizein[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming binsize keyword");
             ffpmsg(binname[ii]);
             return(*status);
         }
      }

      if (binsizein[ii] == 0.)
      {
        ffpmsg("error: histogram binsize = 0");
        return(*status = ZERO_SCALE);
      }

      /* use TDBINn keyword or else 1 if bin size is not given */
      if (binsizein[ii] != DOUBLENULLVALUE)
      { 
         binsize[ii] = (double) binsizein[ii];
      }
      else
      {
         tstatus = 0;

	 if (colexpr == 0 || colexpr[ii] == 0 || colexpr[ii][0] == '\0')
	 {
	   ffkeyn("TDBIN", colnum[ii], keyname, &tstatus);
	   ffgky(fptr, TDOUBLE, keyname, binsizein + ii, NULL, &tstatus);
	 }

         if (tstatus || 
	     colexpr && colexpr[ii] && colexpr[ii][0]) {
	    /* make at least 10 bins */
            binsize[ii] = (amax[ii] - amin[ii]) / 10.F ;
            if (binsize[ii] > 1.)
                binsize[ii] = 1.;  /* use default bin size */
         }
      }

      /* ================================================================ */
      /* if the min is greater than the max, make the binsize negative */
      if ( (amin[ii] > amax[ii] && binsize[ii] > 0. ) ||
           (amin[ii] < amax[ii] && binsize[ii] < 0. ) )
          binsize[ii] =  -binsize[ii];  /* reverse the sign of binsize */


      ibin = (int) binsize[ii];
      imin = (int) amin[ii];
      imax = (int) amax[ii];

      /* Determine the range and number of bins in the histogram. This  */
      /* depends on whether the input columns are integer or floats, so */
      /* treat each case separately.                                    */

      if (datatype <= TLONG && (double) imin == amin[ii] &&
                               (double) imax == amax[ii] &&
                               (double) ibin == binsize[ii] )
      {
        /* This is an integer column and integer limits were entered. */
        /* Shift the lower and upper histogramming limits by 0.5, so that */
        /* the values fall in the center of the bin, not on the edge. */

        haxes[ii] = (imax - imin) / ibin + 1;  /* last bin may only */
                                               /* be partially full */
        if (amin[ii] < amax[ii])
        {
          amin[ii] = (double) (amin[ii] - 0.5);
          amax[ii] = (double) (amax[ii] + 0.5);
        }
        else
        {
          amin[ii] = (double) (amin[ii] + 0.5);
          amax[ii] = (double) (amax[ii] - 0.5);
        }
      }
      else if (use_datamax)  
      {
        /* Either the column datatype and/or the limits are floating point, */
        /* and the histogram limits are being defined by the min and max */
        /* values of the array.  Add 1 to the number of histogram bins to */
        /* make sure that pixels that are equal to the maximum or are */
        /* in the last partial bin are included.  */

        haxes[ii] = (long) (((amax[ii] - amin[ii]) / binsize[ii]) + 1.); 
      }
      else  
      {
        /*  float datatype column and/or limits, and the maximum value to */
        /*  include in the histogram is specified by the calling program. */
        /*  The lower limit is inclusive, but upper limit is exclusive    */
        haxes[ii] = (long) ((amax[ii] - amin[ii]) / binsize[ii]);

        if (amin[ii] < amax[ii])
        {
          if (amin[ii] + (haxes[ii] * binsize[ii]) < amax[ii])
            haxes[ii]++;   /* need to include another partial bin */
        }
        else
        {
          if (amin[ii] + (haxes[ii] * binsize[ii]) > amax[ii])
            haxes[ii]++;   /* need to include another partial bin */
        }
      }
    }

    return(*status);
}